

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicalSystem.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::DynamicalSystem::DynamicalSystem
          (DynamicalSystem *this,size_t stateSpaceSize,size_t controlSpaceSize)

{
  this->_vptr_DynamicalSystem = (_func_int **)&PTR__DynamicalSystem_0019a5e8;
  this->m_stateSize = stateSpaceSize;
  this->m_controlSize = controlSpaceSize;
  iDynTree::VectorDynSize::VectorDynSize(&this->m_initialState,stateSpaceSize & 0xffffffff);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_controlInput,controlSpaceSize & 0xffffffff);
  iDynTree::VectorDynSize::zero();
  iDynTree::VectorDynSize::zero();
  return;
}

Assistant:

DynamicalSystem::DynamicalSystem(size_t stateSpaceSize,
                                         size_t controlSpaceSize)
        : m_stateSize(stateSpaceSize)
        , m_controlSize(controlSpaceSize)
        , m_initialState(static_cast<unsigned int>(stateSpaceSize))
        , m_controlInput(static_cast<unsigned int>(controlSpaceSize))
        {
            m_initialState.zero();
            m_controlInput.zero();
        }